

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

int Vec_WrdSortCompare1(word *pp1,word *pp2)

{
  word *pp2_local;
  word *pp1_local;
  
  if (*pp1 < *pp2) {
    pp1_local._4_4_ = -1;
  }
  else if (*pp2 < *pp1) {
    pp1_local._4_4_ = 1;
  }
  else {
    pp1_local._4_4_ = 0;
  }
  return pp1_local._4_4_;
}

Assistant:

static int Vec_WrdSortCompare1( word * pp1, word * pp2 )
{
    // for some reason commenting out lines (as shown) led to crashing of the release version
    if ( *pp1 < *pp2 )
        return -1;
    if ( *pp1 > *pp2 ) //
        return 1;
    return 0; //
}